

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

rb_tree_node_base *
nestl::impl::detail::rb_tree_decrement<nestl::impl::detail::rb_tree_node_base*>
          (rb_tree_node_base *x)

{
  base_ptr local_20;
  rb_tree_node_base *y_1;
  rb_tree_node_base *y;
  rb_tree_node_base *x_local;
  
  if ((x->m_color == rb_red) && (x->m_parent->m_parent == x)) {
    y = x->m_right;
  }
  else if (x->m_left == (base_ptr)0x0) {
    y = x;
    for (local_20 = x->m_parent; y == local_20->m_left; local_20 = local_20->m_parent) {
      y = local_20;
    }
    y = local_20;
  }
  else {
    for (y_1 = x->m_left; y_1->m_right != (base_ptr)0x0; y_1 = y_1->m_right) {
    }
    y = y_1;
  }
  return y;
}

Assistant:

RbTreeNodeBasePtr rb_tree_decrement(RbTreeNodeBasePtr x) NESTL_NOEXCEPT_SPEC
{
    if (x->m_color == rb_red && x->m_parent->m_parent == x)
        x = x->m_right;
    else if (x->m_left != 0)
    {
        RbTreeNodeBasePtr y = x->m_left;
        while (y->m_right != 0)
            y = y->m_right;
        x = y;
    }
    else
    {
        RbTreeNodeBasePtr y = x->m_parent;
        while (x == y->m_left)
        {
            x = y;
            y = y->m_parent;
        }
        x = y;
    }
    return x;
}